

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O1

void __thiscall
ThreadContext::UnregisterIsInstInlineCache
          (ThreadContext *this,IsInstInlineCache *inlineCache,Var function)

{
  IsInstInlineCache *pIVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  IsInstInlineCache *pIVar5;
  int local_34;
  Var pvStack_30;
  int i;
  Var function_local;
  IsInstInlineCache **inlineCacheRef;
  
  pvStack_30 = function;
  if (inlineCache == (IsInstInlineCache *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0xf12,"(inlineCache != nullptr)","inlineCache != nullptr");
    if (!bVar3) goto LAB_007c0e73;
    *puVar4 = 0;
  }
  function_local = (Var)0x0;
  bVar3 = JsUtil::
          BaseDictionary<void*,Js::IsInstInlineCache*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<void*>
                    ((BaseDictionary<void*,Js::IsInstInlineCache*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)&this->isInstInlineCacheByFunction,&stack0xffffffffffffffd0,
                     (IsInstInlineCache ***)&function_local,&local_34);
  if (bVar3) {
    if (*function_local == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                         ,0xf17,"(*inlineCacheRef != nullptr)","*inlineCacheRef != nullptr");
      if (!bVar3) {
LAB_007c0e73:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    pIVar1 = *function_local;
    if (pIVar1 == inlineCache) {
      *(IsInstInlineCache **)function_local = pIVar1->next;
      if (*function_local == 0) {
        JsUtil::
        BaseDictionary<void_*,_Js::IsInstInlineCache_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        ::Remove(&this->isInstInlineCacheByFunction,&stack0xffffffffffffffd0);
      }
    }
    else {
      do {
        pIVar5 = pIVar1;
        pIVar1 = pIVar5->next;
        if (pIVar1 == (IsInstInlineCache *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar4 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                             ,0xf2d,"(false)",
                             "Why are we unregistering a cache that is not registered?");
          if (bVar3) {
            *puVar4 = 0;
            return;
          }
          goto LAB_007c0e73;
        }
      } while (pIVar1 != inlineCache);
      pIVar5->next = pIVar1->next;
    }
  }
  return;
}

Assistant:

void
ThreadContext::UnregisterIsInstInlineCache(Js::IsInstInlineCache * inlineCache, Js::Var function)
{
    Assert(inlineCache != nullptr);
    Js::IsInstInlineCache** inlineCacheRef = nullptr;

    if (this->isInstInlineCacheByFunction.TryGetReference(function, &inlineCacheRef))
    {
        Assert(*inlineCacheRef != nullptr);
        if (inlineCache == *inlineCacheRef)
        {
            *inlineCacheRef = (*inlineCacheRef)->next;
            if (*inlineCacheRef == nullptr)
            {
                this->isInstInlineCacheByFunction.Remove(function);
            }
        }
        else
        {
            Js::IsInstInlineCache * prevInlineCache;
            Js::IsInstInlineCache * curInlineCache;
            for (prevInlineCache = *inlineCacheRef, curInlineCache = (*inlineCacheRef)->next; curInlineCache != nullptr;
                prevInlineCache = curInlineCache, curInlineCache = curInlineCache->next)
            {
                if (curInlineCache == inlineCache)
                {
                    prevInlineCache->next = curInlineCache->next;
                    return;
                }
            }
            AssertMsg(false, "Why are we unregistering a cache that is not registered?");
        }
    }
}